

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O0

void __thiscall
soul::AST::Namespace::addSpecialisationParameter(Namespace *this,NamespaceAliasDeclaration *n)

{
  pool_ref<soul::AST::ASTObject> local_38 [3];
  pool_ref<soul::AST::NamespaceAliasDeclaration> local_20;
  NamespaceAliasDeclaration *local_18;
  NamespaceAliasDeclaration *n_local;
  Namespace *this_local;
  
  local_18 = n;
  n_local = (NamespaceAliasDeclaration *)this;
  pool_ref<soul::AST::NamespaceAliasDeclaration>::
  pool_ref<soul::AST::NamespaceAliasDeclaration,void>(&local_20,n);
  std::
  vector<soul::pool_ref<soul::AST::NamespaceAliasDeclaration>,_std::allocator<soul::pool_ref<soul::AST::NamespaceAliasDeclaration>_>_>
  ::push_back(&(this->super_ModuleBase).namespaceAliases,&local_20);
  pool_ref<soul::AST::NamespaceAliasDeclaration>::~pool_ref(&local_20);
  pool_ref<soul::AST::ASTObject>::pool_ref<soul::AST::NamespaceAliasDeclaration,void>
            (local_38,local_18);
  std::
  vector<soul::pool_ref<soul::AST::ASTObject>,_std::allocator<soul::pool_ref<soul::AST::ASTObject>_>_>
  ::push_back(&(this->super_ModuleBase).specialisationParams,local_38);
  pool_ref<soul::AST::ASTObject>::~pool_ref(local_38);
  return;
}

Assistant:

void addSpecialisationParameter (NamespaceAliasDeclaration& n) override
        {
            namespaceAliases.push_back (n);
            specialisationParams.push_back (n);
        }